

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O0

t_object *
xemmai::
f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
          (t_type *a_type,t_object **a_xs,t_value<xemmai::t_pointer> *a_xs_1,
          t_value<xemmai::t_pointer> *a_xs_2)

{
  size_t sVar1;
  t_queue<128UL> *this;
  t_queue<256UL> *this_00;
  size_t sVar2;
  t_engine *ptVar3;
  long *plVar4;
  t_svalue *ptVar5;
  t_object *ptVar6;
  undefined8 *puVar7;
  t_object *p;
  t_value<xemmai::t_pointer> *a_xs_local_2;
  t_value<xemmai::t_pointer> *a_xs_local_1;
  t_object **a_xs_local;
  t_type *a_type_local;
  t_object *p_1;
  t_object *p_2;
  t_object *local_18;
  
  sVar1 = a_type->v_fields_offset;
  sVar2 = t_object::f_fields_offset(0);
  if (sVar1 != sVar2) {
    __assert_fail("a_type->v_fields_offset == t_object::f_fields_offset(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                  ,0x173,
                  "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
                 );
  }
  if (a_type->v_instance_fields == 3) {
    ptVar3 = f_engine();
    plVar4 = (long *)__tls_get_addr(&PTR_00163d80);
    local_18 = (t_object *)*plVar4;
    if (local_18 == (t_object *)0x0) {
      local_18 = t_heap<xemmai::t_object>::f_allocate_from<0ul,65536ul>
                           ((t_heap<xemmai::t_object> *)(ptVar3 + 0x30),
                            (t_of<0UL,_65536UL> *)(ptVar3 + 0x90));
    }
    else {
      ptVar6 = local_18->v_next;
      puVar7 = (undefined8 *)__tls_get_addr(&PTR_00163d80);
      *puVar7 = ptVar6;
    }
    local_18->v_next = (t_object *)0x0;
    ptVar5 = t_object::f_fields(local_18,0);
    f__construct<0ul,1ul,2ul,xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
              (ptVar5,a_xs,a_xs_1,a_xs_2);
    ptVar6 = t_object::f_of(a_type);
    puVar7 = (undefined8 *)__tls_get_addr(&PTR_00163c50);
    this = (t_queue<128UL> *)*puVar7;
    *this->v_head = ptVar6;
    if (this->v_head == this->v_next) {
      t_slot::t_queue<128UL>::f_next(this);
    }
    else {
      this->v_head = this->v_head + 1;
    }
    local_18->v_type = a_type;
    puVar7 = (undefined8 *)__tls_get_addr(&PTR_00163ca8);
    this_00 = (t_queue<256UL> *)*puVar7;
    *this_00->v_head = local_18;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<256UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
    return local_18;
  }
  __assert_fail("a_type->v_instance_fields == sizeof...(a_xs)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/include/xemmai/engine.h"
                ,0x174,
                "t_object *xemmai::f_new_value(t_type *, auto &&...) [a_xs:auto = <xemmai::t_object *, xemmai::t_value<xemmai::t_pointer>, xemmai::t_value<xemmai::t_pointer>>]"
               );
}

Assistant:

inline t_object* f_new_value(t_type* a_type, auto&&... a_xs)
{
	assert(a_type->v_fields_offset == t_object::f_fields_offset(0));
	assert(a_type->v_instance_fields == sizeof...(a_xs));
	auto p = f_engine()->f_allocate(sizeof(t_svalue) * sizeof...(a_xs));
	f__construct(p->f_fields(0), std::make_index_sequence<sizeof...(a_xs)>(), std::forward<decltype(a_xs)>(a_xs)...);
	p->f_be(a_type);
	return p;
}